

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QStaticTextItem>::emplace<QStaticTextItem_const&>
          (QMovableArrayOps<QStaticTextItem> *this,qsizetype i,QStaticTextItem *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QStaticTextItem> *in_RSI;
  QArrayDataPointer<QStaticTextItem> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QStaticTextItem tmp;
  QStaticTextItem *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff64;
  byte bVar6;
  GrowthPosition where;
  undefined1 local_58 [80];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QStaticTextItem>::needsDetach
                    ((QArrayDataPointer<QStaticTextItem> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QStaticTextItem> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QStaticTextItem>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QStaticTextItem>::end
                ((QArrayDataPointer<QStaticTextItem> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      QStaticTextItem::QStaticTextItem
                ((QStaticTextItem *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00797a08;
    }
    if ((in_RSI == (QArrayDataPointer<QStaticTextItem> *)0x0) &&
       (qVar3 = QArrayDataPointer<QStaticTextItem>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QStaticTextItem>::begin((QArrayDataPointer<QStaticTextItem> *)0x7978da);
      QStaticTextItem::QStaticTextItem
                ((QStaticTextItem *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00797a08;
    }
  }
  memset(local_58,0xaa,0x50);
  QStaticTextItem::QStaticTextItem
            ((QStaticTextItem *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QStaticTextItem> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QStaticTextItem> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QStaticTextItem>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff64,uVar2))),
             (QStaticTextItem **)in_RDI,
             (QArrayDataPointer<QStaticTextItem> *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff64,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff50),
                       (qsizetype)in_stack_ffffffffffffff48);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
    Inserter::~Inserter((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
  }
  else {
    QArrayDataPointer<QStaticTextItem>::begin((QArrayDataPointer<QStaticTextItem> *)0x79799c);
    QStaticTextItem::QStaticTextItem
              ((QStaticTextItem *)CONCAT17(uVar5,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QStaticTextItem::~QStaticTextItem((QStaticTextItem *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
LAB_00797a08:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }